

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

Matrix<float,_3,_3> *
deqp::gles3::Functional::MatrixCaseUtils::inverse<3>
          (Matrix<float,_3,_3> *__return_storage_ptr__,Matrix<float,_3,_3> *mat)

{
  float fVar1;
  float *pfVar2;
  float local_158;
  float local_154;
  float result [9];
  float blockD;
  Matrix<float,_1,_2> local_124;
  Matrix<float,_1,_2> blockC;
  Matrix<float,_2,_1> local_10c;
  Matrix<float,_2,_1> local_104;
  Matrix<float,_2,_1> blockB;
  Matrix<float,_2,_1> local_f4;
  Matrix<float,_2,_2> local_ec;
  Matrix<float,_2,_2> local_dc;
  undefined1 local_cc [8];
  Matrix<float,_2,_2> blockA;
  Matrix<float,_2,_2> zeroMat;
  Matrix<float,_1,_1> local_a4;
  Matrix<float,_1,_1> local_a0;
  float local_9c;
  Matrix<float,_1,_1> local_98;
  float schurComplement;
  Matrix<float,_1,_1> matD;
  Matrix<float,_1,_2> matC;
  Matrix<float,_2,_1> matB;
  Matrix<float,_2,_2> local_78;
  undefined1 local_68 [8];
  Matrix<float,_2,_2> invA;
  float nullField [4];
  float local_3c;
  float local_38;
  float areaD [1];
  float areaC [2];
  float areaB [2];
  float areaA [4];
  Matrix<float,_3,_3> *mat_local;
  
  pfVar2 = tcu::Matrix<float,_3,_3>::operator()(mat,0,0);
  areaB[0] = *pfVar2;
  pfVar2 = tcu::Matrix<float,_3,_3>::operator()(mat,0,1);
  areaB[1] = *pfVar2;
  tcu::Matrix<float,_3,_3>::operator()(mat,1,0);
  tcu::Matrix<float,_3,_3>::operator()(mat,1,1);
  pfVar2 = tcu::Matrix<float,_3,_3>::operator()(mat,0,2);
  areaC[0] = *pfVar2;
  pfVar2 = tcu::Matrix<float,_3,_3>::operator()(mat,1,2);
  areaC[1] = *pfVar2;
  pfVar2 = tcu::Matrix<float,_3,_3>::operator()(mat,2,0);
  local_38 = *pfVar2;
  pfVar2 = tcu::Matrix<float,_3,_3>::operator()(mat,2,1);
  areaD[0] = *pfVar2;
  pfVar2 = tcu::Matrix<float,_3,_3>::operator()(mat,2,2);
  local_3c = *pfVar2;
  invA.m_data.m_data[1].m_data[0] = 0.0;
  invA.m_data.m_data[1].m_data[1] = 0.0;
  tcu::Matrix<float,_2,_2>::Matrix(&local_78,areaB);
  inverse<2>((MatrixCaseUtils *)local_68,&local_78);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_78);
  tcu::Matrix<float,_2,_1>::Matrix((Matrix<float,_2,_1> *)&matC,areaC);
  tcu::Matrix<float,_1,_2>::Matrix((Matrix<float,_1,_2> *)&schurComplement,&local_38);
  tcu::Matrix<float,_1,_1>::Matrix(&local_98,&local_3c);
  tcu::operator*((tcu *)(zeroMat.m_data.m_data + 1),(Matrix<float,_1,_2> *)&schurComplement,
                 (Matrix<float,_2,_2> *)local_68);
  tcu::operator*((tcu *)&local_a4,(Matrix<float,_1,_2> *)(zeroMat.m_data.m_data + 1),
                 (Matrix<float,_2,_1> *)&matC);
  tcu::operator-((tcu *)&local_a0,&local_98,&local_a4);
  pfVar2 = tcu::Matrix<float,_1,_1>::operator()(&local_a0,0,0);
  fVar1 = *pfVar2;
  tcu::Matrix<float,_1,_1>::~Matrix(&local_a0);
  tcu::Matrix<float,_1,_1>::~Matrix(&local_a4);
  tcu::Matrix<float,_1,_2>::~Matrix((Matrix<float,_1,_2> *)(zeroMat.m_data.m_data + 1));
  local_9c = 1.0 / fVar1;
  tcu::Matrix<float,_2,_2>::Matrix
            ((Matrix<float,_2,_2> *)(blockA.m_data.m_data + 1),invA.m_data.m_data[1].m_data);
  tcu::operator*((tcu *)&blockB,(Matrix<float,_2,_2> *)local_68,(Matrix<float,_2,_1> *)&matC);
  tcu::operator*((tcu *)&local_f4,&blockB,local_9c);
  tcu::operator*((tcu *)&local_ec,&local_f4,(Matrix<float,_1,_2> *)&schurComplement);
  tcu::operator*((tcu *)&local_dc,&local_ec,(Matrix<float,_2,_2> *)local_68);
  tcu::operator+((tcu *)local_cc,(Matrix<float,_2,_2> *)local_68,&local_dc);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_dc);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_ec);
  tcu::Matrix<float,_2,_1>::~Matrix(&local_f4);
  tcu::Matrix<float,_2,_1>::~Matrix(&blockB);
  tcu::operator-((tcu *)&blockC,(Matrix<float,_2,_2> *)(blockA.m_data.m_data + 1),
                 (Matrix<float,_2,_2> *)local_68);
  tcu::operator*((tcu *)&local_10c,(Matrix<float,_2,_2> *)&blockC,(Matrix<float,_2,_1> *)&matC);
  tcu::operator*((tcu *)&local_104,&local_10c,local_9c);
  tcu::Matrix<float,_2,_1>::~Matrix(&local_10c);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)&blockC);
  tcu::operator*((tcu *)&stack0xfffffffffffffed4,(Matrix<float,_1,_2> *)&schurComplement,
                 (Matrix<float,_2,_2> *)local_68);
  tcu::operator*((tcu *)&local_124,(Matrix<float,_1,_2> *)&stack0xfffffffffffffed4,-local_9c);
  tcu::Matrix<float,_1,_2>::~Matrix((Matrix<float,_1,_2> *)&stack0xfffffffffffffed4);
  result[8] = local_9c;
  pfVar2 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)local_cc,0,0);
  local_158 = *pfVar2;
  pfVar2 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)local_cc,0,1);
  local_154 = *pfVar2;
  pfVar2 = tcu::Matrix<float,_2,_1>::operator()(&local_104,0,0);
  result[0] = *pfVar2;
  pfVar2 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)local_cc,1,0);
  result[1] = *pfVar2;
  pfVar2 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)local_cc,1,1);
  result[2] = *pfVar2;
  pfVar2 = tcu::Matrix<float,_2,_1>::operator()(&local_104,1,0);
  result[3] = *pfVar2;
  pfVar2 = tcu::Matrix<float,_1,_2>::operator()(&local_124,0,0);
  result[4] = *pfVar2;
  pfVar2 = tcu::Matrix<float,_1,_2>::operator()(&local_124,0,1);
  result[5] = *pfVar2;
  result[6] = result[8];
  tcu::Matrix<float,_3,_3>::Matrix(__return_storage_ptr__,&local_158);
  tcu::Matrix<float,_1,_2>::~Matrix(&local_124);
  tcu::Matrix<float,_2,_1>::~Matrix(&local_104);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)local_cc);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)(blockA.m_data.m_data + 1));
  tcu::Matrix<float,_1,_1>::~Matrix(&local_98);
  tcu::Matrix<float,_1,_2>::~Matrix((Matrix<float,_1,_2> *)&schurComplement);
  tcu::Matrix<float,_2,_1>::~Matrix((Matrix<float,_2,_1> *)&matC);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<float, 3, 3> inverse<3> (const tcu::Matrix<float, 3, 3>& mat)
{
	// Blockwise inversion

	DE_ASSERT(determinant(mat) != 0.0f);

	const float areaA[2*2] =
	{
		mat(0,0),	mat(0,1),
		mat(1,0),	mat(1,1)
	};
	const float areaB[2] =
	{
		mat(0,2),
		mat(1,2),
	};
	const float areaC[2] =
	{
		mat(2,0),	mat(2,1),
	};
	const float areaD[1] =
	{
		mat(2,2)
	};
	const float nullField[4] = { 0.0f };

	const tcu::Matrix<float, 2, 2>	invA = inverse(tcu::Matrix<float, 2, 2>(areaA));
	const tcu::Matrix<float, 2, 1>	matB =         tcu::Matrix<float, 2, 1>(areaB);
	const tcu::Matrix<float, 1, 2>	matC =         tcu::Matrix<float, 1, 2>(areaC);
	const tcu::Matrix<float, 1, 1>	matD =         tcu::Matrix<float, 1, 1>(areaD);

	const float						schurComplement = 1.0f / (matD - matC*invA*matB)(0,0);
	const tcu::Matrix<float, 2, 2>	zeroMat         = Mat2(nullField);

	const tcu::Matrix<float, 2, 2>	blockA = invA + invA*matB*schurComplement*matC*invA;
	const tcu::Matrix<float, 2, 1>	blockB = (zeroMat-invA)*matB*schurComplement;
	const tcu::Matrix<float, 1, 2>	blockC = matC*invA*(-schurComplement);
	const float						blockD = schurComplement;

	const float result[3*3] =
	{
		blockA(0,0),	blockA(0,1),	blockB(0,0),
		blockA(1,0),	blockA(1,1),	blockB(1,0),
		blockC(0,0),	blockC(0,1),	blockD,
	};

	return Mat3(result);
}